

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask exprListTableUsage(WhereMaskSet *pMaskSet,ExprList *pList)

{
  int iVar1;
  ExprList_item *pEVar2;
  Bitmask BVar3;
  long lVar4;
  Bitmask BVar5;
  
  if ((pList == (ExprList *)0x0) || (iVar1 = pList->nExpr, (long)iVar1 < 1)) {
    BVar5 = 0;
  }
  else {
    pEVar2 = pList->a;
    lVar4 = 0;
    BVar5 = 0;
    do {
      BVar3 = exprTableUsage(pMaskSet,*(Expr **)((long)&pEVar2->pExpr + lVar4));
      BVar5 = BVar5 | BVar3;
      lVar4 = lVar4 + 0x20;
    } while ((long)iVar1 * 0x20 != lVar4);
  }
  return BVar5;
}

Assistant:

static Bitmask exprListTableUsage(WhereMaskSet *pMaskSet, ExprList *pList){
  int i;
  Bitmask mask = 0;
  if( pList ){
    for(i=0; i<pList->nExpr; i++){
      mask |= exprTableUsage(pMaskSet, pList->a[i].pExpr);
    }
  }
  return mask;
}